

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O3

void __thiscall
TextProcessor<HtmlListPolicy>::append_list
          (TextProcessor<HtmlListPolicy> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *items)

{
  HtmlListPolicy *this_00;
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  pointer item_00;
  
  this_00 = &this->m_strategy;
  HtmlListPolicy::begin(this_00,&this->m_res);
  pbVar1 = (items->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (item_00 = (items->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; item_00 != pbVar1;
      item_00 = item_00 + 1) {
    HtmlListPolicy::add_list_item(this_00,&this->m_res,item_00);
  }
  HtmlListPolicy::end(this_00,&this->m_res);
  return;
}

Assistant:

void append_list(const std::vector<std::string>& items)
	{
		m_strategy.begin(m_res);
		for(const auto& item : items)
		{
			m_strategy.add_list_item(m_res, item);
		}
		m_strategy.end(m_res);
	}